

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative-simple.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  llama_token lVar1;
  void *pvVar2;
  llama_token *plVar3;
  _Head_base<0UL,_llama_context_*,_false> _Var4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  _Head_base<0UL,_llama_context_*,_false> _Var5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  common_log *pcVar10;
  long lVar11;
  undefined8 uVar12;
  char *pcVar13;
  llama_token *plVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  common_speculative_params params_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  llama_token id_last;
  vector<int,_std::allocator<int>_> ids;
  llama_tokens draft;
  string token_str;
  llama_tokens prompt_tgt;
  llama_batch batch_tgt;
  common_init_result llama_init_tgt;
  common_init_result llama_init_dft;
  common_params params;
  int32_t iVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int8_t *piVar23;
  uint local_1550;
  allocator_type local_1549;
  _Head_base<0UL,_llama_context_*,_false> local_1548;
  tuple<llama_model_*,_llama_model_deleter> local_1540;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1538;
  vector<int,_std::allocator<int>_> local_1530;
  llama_tokens local_1518;
  long local_1500;
  ulong local_14f8;
  long local_14f0;
  long local_14e8;
  string local_14e0;
  common_sampler *local_14c0;
  ulong local_14b8;
  float local_14ac;
  vector<int,_std::allocator<int>_> local_14a8;
  _Head_base<0UL,_llama_context_*,_false> local_1490;
  common_speculative *local_1488;
  ulong local_1480;
  undefined1 local_1478 [32];
  undefined4 local_1458;
  undefined4 uStack_1450;
  int8_t *local_1448;
  ulong local_1440;
  long local_1438;
  long local_1430;
  long local_1428;
  ulong local_1420;
  undefined8 local_1418;
  long local_1410;
  undefined8 local_1408;
  common_init_result local_1400;
  common_init_result local_13d8;
  undefined1 local_13b0 [56];
  undefined1 local_1378 [3456];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [96];
  string local_558 [15];
  bool local_35d;
  
  common_params::common_params((common_params *)local_1378);
  iVar8 = 1;
  bVar6 = common_params_parse(argc,argv,(common_params *)local_1378,LLAMA_EXAMPLE_SPECULATIVE,
                              (_func_void_int_char_ptr_ptr *)0x0);
  if (!bVar6) goto LAB_00125ddc;
  if ((int)local_1378._0_4_ < -1) {
    if (common_log_verbosity_thold < 0) goto LAB_00125ddc;
    pcVar10 = common_log_main();
    pcVar13 = "%s: --n-predict must be >= -1\n";
  }
  else {
    common_init();
    if (local_1378._3136_8_ != 0) {
      llama_backend_init();
      llama_numa_init(local_1378._1712_4_);
      common_init_from_params(&local_1400,(common_params *)local_1378);
      local_1408 = llama_model_get_vocab
                             (local_1400.model._M_t.
                              super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                              super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                              super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::operator=
                ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                 (local_1378 + 0x50),
                 (vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
                 (local_1378 + 0x7e0));
      std::__cxx11::string::_M_assign((string *)(local_1378 + 0xd60));
      std::__cxx11::string::_M_assign(local_5f8);
      std::__cxx11::string::_M_assign(local_5d8);
      std::__cxx11::string::_M_assign(local_5b8);
      local_1378._4_4_ = local_1378._2040_4_;
      local_1378._104_4_ = local_1378._2052_4_;
      if (0 < (int)local_1378._2064_4_) {
        local_1378._628_4_ = local_1378._2064_4_;
      }
      local_1378._1160_4_ = local_1378._2596_4_;
      common_init_from_params(&local_13d8,(common_params *)local_1378);
      bVar6 = common_speculative_are_compatible
                        ((llama_context *)
                         local_1400.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
                         (llama_context *)
                         local_13d8.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
      iVar8 = 1;
      if (bVar6) {
        local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
        super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)
             (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)
             local_1400.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
             super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
             super__Head_base<0UL,_llama_model_*,_false>._M_head_impl;
        common_tokenize((vector<int,_std::allocator<int>_> *)local_1478,
                        (llama_context *)
                        local_1400.context._M_t.
                        super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                        super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,local_558,true,
                        true);
        plVar14 = (llama_token *)CONCAT44(local_1478._4_4_,local_1478._0_4_);
        plVar3 = (llama_token *)CONCAT44(local_1478._12_4_,local_1478._8_4_);
        lVar11 = CONCAT44(local_1478._20_4_,local_1478._16_4_);
        local_1548._M_head_impl =
             (llama_context *)
             local_1400.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
             _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
             super__Head_base<0UL,_llama_context_*,_false>._M_head_impl;
        uVar7 = llama_n_ctx(local_1400.context._M_t.
                            super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                            super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        local_14f8 = (long)plVar3 - (long)plVar14 >> 2;
        local_1538._M_current = plVar14;
        local_1500 = lVar11;
        if (uVar7 < (uint)local_14f8) {
          if (common_log_verbosity_thold < 0) {
LAB_0012534e:
            iVar8 = 1;
          }
          else {
            pcVar10 = common_log_main();
            uVar7 = llama_n_ctx(local_1548._M_head_impl);
            pcVar13 = "%s: the prompt exceeds the context size (%d tokens, ctx %d)\n";
LAB_00125323:
            iVar8 = 1;
            common_log_add(pcVar10,GGML_LOG_LEVEL_ERROR,pcVar13,"main",local_14f8,(ulong)uVar7);
          }
        }
        else {
          uVar7 = llama_n_batch(local_1548._M_head_impl);
          if (uVar7 < (uint)local_14f8) {
            if (common_log_verbosity_thold < 0) goto LAB_0012534e;
            pcVar10 = common_log_main();
            uVar7 = llama_n_batch(local_1548._M_head_impl);
            pcVar13 = "%s: the prompt exceeds the batch size (%d tokens, batch %d)\n";
            goto LAB_00125323;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\n\n");
          }
          local_1490._M_head_impl =
               (llama_context *)
               local_13d8.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>.
               _M_t.super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
               super__Head_base<0UL,_llama_context_*,_false>._M_head_impl;
          if (plVar14 != plVar3) {
            do {
              if (-1 < common_log_verbosity_thold) {
                lVar1 = *plVar14;
                pcVar10 = common_log_main();
                common_token_to_piece_abi_cxx11_
                          ((string *)local_1478,local_1548._M_head_impl,lVar1,true);
                common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"%s",
                               CONCAT44(local_1478._4_4_,local_1478._0_4_));
                if ((undefined1 *)CONCAT44(local_1478._4_4_,local_1478._0_4_) != local_1478 + 0x10)
                {
                  operator_delete((undefined1 *)CONCAT44(local_1478._4_4_,local_1478._0_4_),
                                  CONCAT44(local_1478._20_4_,local_1478._16_4_) + 1);
                }
              }
              plVar14 = plVar14 + 1;
            } while (plVar14 != plVar3);
          }
          local_1420 = (ulong)(int)local_1378._2048_4_;
          local_14ac = (float)local_1378._2060_4_;
          lVar11 = ggml_time_us();
          __first._M_current = local_1538._M_current;
          local_14c0 = common_sampler_init((llama_model *)
                                           local_1540.
                                           super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>
                                           .super__Head_base<0UL,_llama_model_*,_false>._M_head_impl
                                           ,(common_params_sampling *)(local_1378 + 0x6c0));
          _Var5._M_head_impl = local_1490._M_head_impl;
          local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
          super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)(ulong)((int)local_14f8 - 1);
          llama_batch_get_one(local_13b0,__first._M_current);
          llama_decode(local_1548._M_head_impl);
          local_1550 = plVar3[-1];
          std::vector<int,std::allocator<int>>::
          vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                    ((vector<int,std::allocator<int>> *)&local_14a8,__first,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     (plVar3 + -1),(allocator_type *)local_1478);
          _Var4._M_head_impl = local_1548._M_head_impl;
          uVar7 = llama_n_ctx(local_1548._M_head_impl);
          std::vector<int,_std::allocator<int>_>::reserve(&local_14a8,(ulong)uVar7);
          iVar8 = llama_n_ctx(_Var5._M_head_impl);
          local_1488 = common_speculative_init(_Var5._M_head_impl);
          uVar9 = llama_n_batch(_Var4._M_head_impl);
          llama_batch_init(local_1478,uVar9,0,1);
          local_1430 = ggml_time_us();
          local_1428 = lVar11;
          local_1438 = ggml_time_us();
          local_1418 = CONCAT44(iVar8 - local_1378._2044_4_,local_1378._2044_4_);
          local_1480 = 0;
          local_14f0 = 0;
          local_14b8 = 0;
          local_14e8 = 0;
          local_1440 = (ulong)(uint)local_1378._2044_4_;
          do {
            params_00.p_min = local_14ac;
            params_00.n_draft = (undefined4)local_1418;
            params_00.n_reuse = local_1418._4_4_;
            common_speculative_gen_draft(&local_1518,local_1488,params_00,&local_14a8,local_1550);
            common_batch_clear((llama_batch *)local_1478);
            uVar7 = local_1550;
            local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start._0_4_ = 0;
            __l._M_len = 1;
            __l._M_array = (iterator)&local_1530;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_14e0,__l,&local_1549);
            common_batch_add((llama_batch *)local_1478,uVar7,
                             (llama_pos)
                             local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                             super__Head_base<0UL,_llama_model_*,_false>._M_head_impl,
                             (vector<int,_std::allocator<int>_> *)&local_14e0,true);
            if (local_14e0._M_dataplus._M_p != (pointer)0x0) {
              operator_delete(local_14e0._M_dataplus._M_p,
                              local_14e0.field_2._M_allocated_capacity -
                              (long)local_14e0._M_dataplus._M_p);
            }
            if (((long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start != 0) &&
               ((ulong)((long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) < local_1420)) {
              local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
            }
            if (local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              iVar8 = (int)local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                           super__Head_base<0UL,_llama_model_*,_false>._M_head_impl;
              uVar15 = 0;
              do {
                lVar1 = local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar15];
                local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ = 0;
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)&local_1530;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&local_14e0,__l_00,&local_1549);
                common_batch_add((llama_batch *)local_1478,lVar1,iVar8 + 1 + (int)uVar15,
                                 (vector<int,_std::allocator<int>_> *)&local_14e0,true);
                if (local_14e0._M_dataplus._M_p != (pointer)0x0) {
                  operator_delete(local_14e0._M_dataplus._M_p,
                                  local_14e0.field_2._M_allocated_capacity -
                                  (long)local_14e0._M_dataplus._M_p);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)((long)local_1518.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                        (long)local_1518.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start >> 2));
            }
            _Var4._M_head_impl = local_1548._M_head_impl;
            iVar18 = local_1478._0_4_;
            uVar9 = local_1478._8_4_;
            uVar19 = local_1478._16_4_;
            uVar20 = local_1478._24_4_;
            uVar21 = local_1458;
            uVar22 = uStack_1450;
            piVar23 = local_1448;
            llama_decode(local_1548._M_head_impl);
            common_sampler_sample_and_accept_n
                      (&local_1530,local_14c0,_Var4._M_head_impl,&local_1518,false);
            lVar11 = (long)local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     CONCAT44(local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
            if (lVar11 == 0) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/speculative-simple/speculative-simple.cpp"
                         ,0xb8,"GGML_ASSERT(%s) failed","ids.size() > 0");
            }
            local_1410 = (long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
            if (local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (pointer)CONCAT44(local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_)) {
              uVar15 = 0;
              do {
                if (local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_14a8,
                             (iterator)
                             local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,(int *)&local_1550);
                }
                else {
                  *local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_1550;
                  local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                local_1550 = *(uint *)(CONCAT44(local_1530.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_1530.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      uVar15 * 4);
                uVar12 = llama_vocab_is_eog(local_1408);
                if ((char)uVar12 != '\0') {
                  local_1480 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
                  break;
                }
                common_token_to_piece_abi_cxx11_(&local_14e0,_Var4._M_head_impl,local_1550,true);
                if ((local_35d == true) &&
                   (uVar15 + 1 <
                    (ulong)((long)local_1530.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            CONCAT44(local_1530.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_1530.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) >> 2))) {
                  if (-1 < common_log_verbosity_thold) {
                    pcVar10 = common_log_main();
                    common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\x1b[%dm%s\x1b[37m",0x24,
                                   local_14e0._M_dataplus._M_p);
                  }
                }
                else if (-1 < common_log_verbosity_thold) {
                  pcVar10 = common_log_main();
                  common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"%s",local_14e0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_14e0._M_dataplus._M_p != &local_14e0.field_2) {
                  operator_delete(local_14e0._M_dataplus._M_p,
                                  local_14e0.field_2._M_allocated_capacity + 1);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (ulong)((long)local_1530.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                        CONCAT44(local_1530.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_1530.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start._0_4_) >>
                                       2));
            }
            if (0 < common_log_verbosity_thold) {
              pcVar10 = common_log_main();
              common_log_add(pcVar10,GGML_LOG_LEVEL_DEBUG,
                             "accepted %d/%d draft tokens, the last target token is: (%d)\n",
                             (ulong)((int)((ulong)((long)local_1530.
                                                                                                                  
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  CONCAT44(local_1530.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_1530.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_))
                                          >> 2) - 1),
                             (ulong)((long)local_1518.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_1518.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2,
                             (ulong)local_1550,iVar18,uVar9,uVar19,uVar20,uVar21,uVar22,piVar23);
            }
            lVar11 = lVar11 >> 2;
            local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
            super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>)
                 (ulong)(uint)((int)local_1540.
                                    super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                                    super__Head_base<0UL,_llama_model_*,_false>._M_head_impl +
                              (int)lVar11);
            if (0 < common_log_verbosity_thold) {
              pcVar10 = common_log_main();
              common_log_add(pcVar10,GGML_LOG_LEVEL_DEBUG,
                             "clear kv cache from any extra tokens, n_past = %d\n",
                             local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                             super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
            }
            llama_kv_self_seq_rm
                      (_Var4._M_head_impl,0,
                       local_1540.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                       super__Head_base<0UL,_llama_model_*,_false>._M_head_impl,0xffffffff);
            local_14e8 = (int)local_14e8 + lVar11;
            bVar16 = (int)local_1378._0_4_ < 0;
            bVar6 = (int)local_14e8 <= (int)local_1378._0_4_;
            pvVar2 = (void *)CONCAT44(local_1530.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_1530.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_4_);
            if (pvVar2 != (void *)0x0) {
              operator_delete(pvVar2,(long)local_1530.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage -
                                     (long)pvVar2);
            }
            if (local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage -
                              (long)local_1518.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start);
            }
            _Var4._M_head_impl = local_1548._M_head_impl;
            local_14b8 = (long)(int)local_14b8 + (local_1410 >> 2);
            local_14f0 = (int)local_14f0 + lVar11 + -1;
          } while ((bVar16 || bVar6) && (local_1480 & 1) == 0);
          lVar11 = ggml_time_us();
          _Var5._M_head_impl = local_1490._M_head_impl;
          uVar15 = local_14b8;
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\n\n");
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            fVar17 = (float)(local_1430 - local_1428) / 1e+06;
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,
                           "encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                           SUB84((double)fVar17,0),SUB84((double)((float)local_14f8 / fVar17),0));
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            fVar17 = (float)(lVar11 - local_1438) / 1e+06;
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,
                           "decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                           SUB84((double)fVar17,0),
                           SUB84((double)((float)(int)local_14e8 / fVar17),0));
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"\n");
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"n_draft   = %d\n",local_1440);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"n_predict = %d\n",local_14e8);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"n_drafted = %d\n",uVar15 & 0xffffffff);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"n_accept  = %d\n",local_14f0);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"accept    = %.3f%%\n",
                           SUB84((double)(((float)(int)local_14f0 * 100.0) / (float)(int)uVar15),0))
            ;
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"\n");
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"draft:\n\n");
          }
          llama_perf_context_print(_Var5._M_head_impl);
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"\n");
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_INFO,"target:\n\n");
          }
          common_perf_print(_Var4._M_head_impl,local_14c0);
          common_sampler_free(local_14c0);
          common_speculative_free(local_1488);
          llama_backend_free();
          if (-1 < common_log_verbosity_thold) {
            pcVar10 = common_log_main();
            common_log_add(pcVar10,GGML_LOG_LEVEL_NONE,"\n\n");
          }
          if (local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_14a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar8 = 0;
        }
        if (local_1538._M_current != (llama_token *)0x0) {
          operator_delete(local_1538._M_current,local_1500 - (long)local_1538._M_current);
        }
      }
      std::
      vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
      ::~vector(&local_13d8.lora);
      std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr(&local_13d8.context);
      std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr(&local_13d8.model);
      std::
      vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
      ::~vector(&local_1400.lora);
      std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr(&local_1400.context);
      std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr(&local_1400.model);
      goto LAB_00125ddc;
    }
    if (common_log_verbosity_thold < 0) goto LAB_00125ddc;
    pcVar10 = common_log_main();
    pcVar13 = "%s: --model-draft is required\n";
  }
  common_log_add(pcVar10,GGML_LOG_LEVEL_ERROR,pcVar13,"main");
LAB_00125ddc:
  common_params::~common_params((common_params *)local_1378);
  return iVar8;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_SPECULATIVE)) {
        return 1;
    }

    if (params.n_predict < -1) {
        LOG_ERR("%s: --n-predict must be >= -1\n", __func__);
        return 1;
    }

    common_init();

    if (params.speculative.model.path.empty()) {
        LOG_ERR("%s: --model-draft is required\n", __func__);
        return 1;
    }

    // init llama.cpp
    llama_backend_init();
    llama_numa_init(params.numa);

    llama_model * model_tgt = NULL;
    //llama_model * model_dft = NULL;

    llama_context * ctx_tgt = NULL;
    llama_context * ctx_dft = NULL;

    // load the target model
    common_init_result llama_init_tgt = common_init_from_params(params);

    model_tgt = llama_init_tgt.model.get();
    ctx_tgt   = llama_init_tgt.context.get();

    const llama_vocab * vocab = llama_model_get_vocab(model_tgt);

    // load the draft model
    params.devices      = params.speculative.devices;
    params.model        = params.speculative.model;
    params.n_ctx        = params.speculative.n_ctx;
    params.n_batch      = params.speculative.n_ctx > 0 ? params.speculative.n_ctx : params.n_batch;
    params.n_gpu_layers = params.speculative.n_gpu_layers;

    if (params.speculative.cpuparams.n_threads > 0) {
        params.cpuparams.n_threads = params.speculative.cpuparams.n_threads;
    }

    params.cpuparams_batch.n_threads = params.speculative.cpuparams_batch.n_threads;
    common_init_result llama_init_dft = common_init_from_params(params);

    //model_dft = llama_init_dft.model.get();
    ctx_dft   = llama_init_dft.context.get();

    if (!common_speculative_are_compatible(ctx_tgt, ctx_dft)) {
        return 1;
    }

    // Tokenize the prompt
    std::vector<llama_token> inp;
    inp = common_tokenize(ctx_tgt, params.prompt, true, true);

    if (llama_n_ctx(ctx_tgt) < (uint32_t) inp.size()) {
        LOG_ERR("%s: the prompt exceeds the context size (%d tokens, ctx %d)\n", __func__, (int) inp.size(), llama_n_ctx(ctx_tgt));

        return 1;
    }

    if (llama_n_batch(ctx_tgt) < (uint32_t) inp.size()) {
        LOG_ERR("%s: the prompt exceeds the batch size (%d tokens, batch %d)\n", __func__, (int) inp.size(), llama_n_batch(ctx_tgt));

        return 1;
    }

    LOG("\n\n");

    for (auto id : inp) {
        LOG("%s", common_token_to_piece(ctx_tgt, id).c_str());
    }

    // how many tokens to draft each time
    int n_draft     = params.speculative.n_max;
    int n_draft_min = params.speculative.n_min;

    float p_min = params.speculative.p_min;

    int n_predict = 0;
    int n_drafted = 0;
    int n_accept  = 0;

    // used to determine end of generation
    bool has_eos = false;

    // ================================================
    // everything until here is standard initialization
    // the relevant stuff for speculative decoding starts here

    const auto t_enc_start = ggml_time_us();

    // target model sampling context
    struct common_sampler * smpl = common_sampler_init(model_tgt, params.sampling);

    // eval the prompt
    llama_decode(ctx_tgt, llama_batch_get_one(inp.data(), inp.size() - 1));

    // note: keep the last token separate!
    llama_token id_last = inp.back();

    // all tokens currently in the target context
    llama_tokens prompt_tgt(inp.begin(), inp.end() - 1);
    prompt_tgt.reserve(llama_n_ctx(ctx_tgt));

    int n_past = inp.size() - 1;

    // init the speculator
    struct common_speculative_params params_spec;
    params_spec.n_draft = n_draft;
    params_spec.n_reuse = llama_n_ctx(ctx_dft) - n_draft;
    params_spec.p_min   = p_min;

    struct common_speculative * spec = common_speculative_init(ctx_dft);

    llama_batch batch_tgt = llama_batch_init(llama_n_batch(ctx_tgt), 0, 1);

    const auto t_enc_end = ggml_time_us();

    const auto t_dec_start = ggml_time_us();

    while (true) {
        // optionally, generate draft tokens that can be appended to the target batch
        //
        // this is the most important part of the speculation. the more probable tokens that are provided here
        // the better the performance will be. in theory, this computation can be performed asynchronously and even
        // offloaded to a remote device. it doesn't even have to be based on an LLM. instead, it can provide tokens
        // from a cache or lookup tables.
        //
        llama_tokens draft = common_speculative_gen_draft(spec, params_spec, prompt_tgt, id_last);

        //LOG_DBG("draft: %s\n", string_from(ctx_dft, draft).c_str());

        // always have a token to evaluate from before - id_last
        common_batch_clear(batch_tgt);
        common_batch_add  (batch_tgt, id_last, n_past++, { 0 }, true);

        // evaluate the target model on [id_last, draft0, draft1, ..., draftN-1]
        {
            // do not waste time on small drafts
            if (draft.size() < (size_t) n_draft_min) {
                draft.clear();
            }

            for (size_t i = 0; i < draft.size(); ++i) {
                common_batch_add(batch_tgt, draft[i], n_past + i, { 0 }, true);
            }

            //LOG_DBG("target batch: %s\n", string_from(ctx_tgt, batch_tgt).c_str());

            llama_decode(ctx_tgt, batch_tgt);
        }

        // sample from the full target batch and return the accepted tokens based on the target sampler
        //
        // for each token to be accepted, the sampler would have to sample that same token
        // in such cases, instead of decoding the sampled token as we normally do, we simply continue with the
        // available logits from the batch and sample the next token until we run out of logits or the sampler
        // disagrees with the draft
        //
        const auto ids = common_sampler_sample_and_accept_n(smpl, ctx_tgt, draft);

        //LOG_DBG("ids: %s\n", string_from(ctx_tgt, ids).c_str());

        GGML_ASSERT(ids.size() > 0); // there will always be at least one accepted token

        n_past    += ids.size() - 1;
        n_drafted += draft.size(); // note: we ignore the discarded small drafts
        n_accept  += ids.size() - 1;
        n_predict += ids.size();

        // process the accepted tokens and update contexts
        //
        // this is the standard token post-processing that we normally do
        // in this case, we do it for a group of accepted tokens at once
        //
        for (size_t i = 0; i < ids.size(); ++i) {
            prompt_tgt.push_back(id_last);

            id_last = ids[i];

            if (llama_vocab_is_eog(vocab, id_last)) {
                has_eos = true;
                break;
            }

            const std::string token_str = common_token_to_piece(ctx_tgt, id_last);

            if (params.use_color && i + 1 < ids.size()) {
                LOG("\u001b[%dm%s\u001b[37m", (36 - 0 % 6), token_str.c_str());
            } else {
                LOG("%s", token_str.c_str());
            }
        }

        LOG_DBG("accepted %d/%d draft tokens, the last target token is: (%d)\n", (int) ids.size() - 1, (int) draft.size(), id_last);

        {
            LOG_DBG("clear kv cache from any extra tokens, n_past = %d\n", n_past);

            llama_kv_self_seq_rm(ctx_tgt, 0, n_past, -1);
        }

        if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
            break;
        }
    }

    auto t_dec_end = ggml_time_us();

    const int n_input = inp.size();

    LOG("\n\n");

    LOG_INF("encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_input,   (t_enc_end - t_enc_start) / 1e6f, inp.size() / ((t_enc_end - t_enc_start) / 1e6f));
    LOG_INF("decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_predict, (t_dec_end - t_dec_start) / 1e6f, n_predict  / ((t_dec_end - t_dec_start) / 1e6f));

    LOG_INF("\n");
    LOG_INF("n_draft   = %d\n", n_draft);
    LOG_INF("n_predict = %d\n", n_predict);
    LOG_INF("n_drafted = %d\n", n_drafted);
    LOG_INF("n_accept  = %d\n", n_accept);
    LOG_INF("accept    = %.3f%%\n", 100.0f * n_accept / n_drafted);

    LOG_INF("\n");
    LOG_INF("draft:\n\n");

    llama_perf_context_print(ctx_dft);

    LOG_INF("\n");
    LOG_INF("target:\n\n");
    common_perf_print(ctx_tgt, smpl);

    common_sampler_free(smpl);
    common_speculative_free(spec);

    llama_backend_free();

    LOG("\n\n");

    return 0;
}